

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::Descriptor::ExtensionRange::CopyTo
          (ExtensionRange *this,DescriptorProto_ExtensionRange *proto)

{
  HasBits<1> *pHVar1;
  uint uVar2;
  FeatureSet *from;
  ExtensionRangeOptions *pEVar3;
  ExtensionRangeOptions *pEVar4;
  FeatureSet *pFVar5;
  Arena *pAVar6;
  
  (proto->field_0)._impl_.start_ = this->start_;
  uVar2 = *(uint *)&proto->field_0;
  (proto->field_0)._impl_._has_bits_.has_bits_[0] = uVar2 | 2;
  (proto->field_0)._impl_.end_ = this->end_;
  (proto->field_0)._impl_._has_bits_.has_bits_[0] = uVar2 | 6;
  pEVar4 = this->options_;
  if (pEVar4 != (ExtensionRangeOptions *)_ExtensionRangeOptions_default_instance_) {
    (proto->field_0)._impl_._has_bits_.has_bits_[0] = uVar2 | 7;
    if ((proto->field_0)._impl_.options_ == (ExtensionRangeOptions *)0x0) {
      pAVar6 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar6 & 1) != 0) {
        pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
      }
      pEVar3 = (ExtensionRangeOptions *)
               Arena::DefaultConstruct<google::protobuf::ExtensionRangeOptions>(pAVar6);
      (proto->field_0)._impl_.options_ = pEVar3;
    }
    ExtensionRangeOptions::CopyFrom((proto->field_0)._impl_.options_,pEVar4);
  }
  from = this->proto_features_;
  if (from != (FeatureSet *)_FeatureSet_default_instance_) {
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 1;
    if ((proto->field_0)._impl_.options_ == (ExtensionRangeOptions *)0x0) {
      pAVar6 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar6 & 1) != 0) {
        pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
      }
      pEVar4 = (ExtensionRangeOptions *)
               Arena::DefaultConstruct<google::protobuf::ExtensionRangeOptions>(pAVar6);
      (proto->field_0)._impl_.options_ = pEVar4;
    }
    pEVar4 = (proto->field_0)._impl_.options_;
    pHVar1 = &(pEVar4->field_0)._impl_._has_bits_;
    pHVar1->has_bits_[0] = pHVar1->has_bits_[0] | 1;
    if ((pEVar4->field_0)._impl_.features_ == (FeatureSet *)0x0) {
      pAVar6 = (Arena *)(pEVar4->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar6 & 1) != 0) {
        pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
      }
      pFVar5 = (FeatureSet *)Arena::DefaultConstruct<google::protobuf::FeatureSet>(pAVar6);
      (pEVar4->field_0)._impl_.features_ = pFVar5;
    }
    FeatureSet::CopyFrom((pEVar4->field_0)._impl_.features_,from);
    return;
  }
  return;
}

Assistant:

void Descriptor::ExtensionRange::CopyTo(
    DescriptorProto_ExtensionRange* proto) const {
  proto->set_start(start_);
  proto->set_end(end_);
  if (options_ != &ExtensionRangeOptions::default_instance()) {
    *proto->mutable_options() = *options_;
  }
  RestoreFeaturesToOptions(proto_features_, proto);
}